

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

void AddThumb1SBit(MCInst *MI,_Bool InITBlock)

{
  ushort uVar1;
  MCOperandInfo *pMVar2;
  _Bool _Var3;
  uint uVar4;
  MCOperand *pMVar5;
  uint local_28;
  uint i;
  unsigned_short NumOps;
  MCOperandInfo *OpInfo;
  _Bool InITBlock_local;
  MCInst *MI_local;
  
  uVar4 = MCInst_getOpcode(MI);
  pMVar2 = ARMInsts[uVar4].OpInfo;
  uVar4 = MCInst_getOpcode(MI);
  uVar1 = ARMInsts[uVar4].NumOperands;
  local_28 = 0;
  while( true ) {
    if ((uVar1 <= local_28) || (uVar4 = MCInst_getNumOperands(MI), local_28 == uVar4)) {
      uVar4 = 3;
      if (InITBlock) {
        uVar4 = 0;
      }
      pMVar5 = MCOperand_CreateReg1(MI,uVar4);
      MCInst_insert0(MI,local_28,pMVar5);
      return;
    }
    _Var3 = MCOperandInfo_isOptionalDef(pMVar2 + local_28);
    if (((_Var3) && (pMVar2[local_28].RegClass == 0xc)) &&
       ((local_28 == 0 || (_Var3 = MCOperandInfo_isPredicate(pMVar2 + (local_28 - 1)), !_Var3))))
    break;
    local_28 = local_28 + 1;
  }
  uVar4 = 3;
  if (InITBlock) {
    uVar4 = 0;
  }
  pMVar5 = MCOperand_CreateReg1(MI,uVar4);
  MCInst_insert0(MI,local_28,pMVar5);
  return;
}

Assistant:

static void AddThumb1SBit(MCInst *MI, bool InITBlock)
{
	MCOperandInfo *OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	unsigned short NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;
	unsigned i;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isOptionalDef(&OpInfo[i]) && OpInfo[i].RegClass == ARM_CCRRegClassID) {
			if (i > 0 && MCOperandInfo_isPredicate(&OpInfo[i-1])) continue;
			MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
			return;
		}
	}

	//MI.insert(I, MCOperand_CreateReg0(Inst, InITBlock ? 0 : ARM_CPSR));
	MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
}